

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QJsonObject __thiscall QVariant::toJsonObject(QVariant *this)

{
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QJsonObject>(in_stack_00000028);
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QJsonObject QVariant::toJsonObject() const
{
    return qvariant_cast<QJsonObject>(*this);
}